

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::MethodDescriptorProto::MergePartialFromCodedStream
          (MethodDescriptorProto *this,CodedInputStream *input)

{
  int iVar1;
  uint8 *puVar2;
  bool bVar3;
  uint uVar4;
  Limit limit;
  undefined8 in_RAX;
  string *psVar5;
  MethodOptions *this_00;
  uint32 tag;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
LAB_001ec31d:
  do {
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (tag = (uint32)(char)*puVar2, -1 < (char)*puVar2)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar2 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    if (tag == 0) {
      return true;
    }
    uVar4 = tag & 7;
    switch(tag >> 3) {
    case 1:
      if (uVar4 == 2) {
        *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
        psVar5 = this->name_;
        if (psVar5 == (string *)internal::kEmptyString_abi_cxx11_) {
          psVar5 = (string *)operator_new(0x20);
          (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
          psVar5->_M_string_length = 0;
          (psVar5->field_2)._M_local_buf[0] = '\0';
          this->name_ = psVar5;
        }
        bVar3 = internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar3) {
          return false;
        }
        internal::WireFormat::VerifyUTF8StringFallback
                  ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,PARSE);
        puVar2 = input->buffer_;
        if ((puVar2 < input->buffer_end_) && (*puVar2 == '\x12')) {
          input->buffer_ = puVar2 + 1;
LAB_001ec426:
          *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
          psVar5 = this->input_type_;
          if (psVar5 == (string *)internal::kEmptyString_abi_cxx11_) {
            psVar5 = (string *)operator_new(0x20);
            (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
            psVar5->_M_string_length = 0;
            (psVar5->field_2)._M_local_buf[0] = '\0';
            this->input_type_ = psVar5;
          }
          bVar3 = internal::WireFormatLite::ReadString(input,psVar5);
          if (!bVar3) {
            return false;
          }
          internal::WireFormat::VerifyUTF8StringFallback
                    ((this->input_type_->_M_dataplus)._M_p,(int)this->input_type_->_M_string_length,
                     PARSE);
          puVar2 = input->buffer_;
          if ((puVar2 < input->buffer_end_) && (*puVar2 == '\x1a')) {
            input->buffer_ = puVar2 + 1;
LAB_001ec497:
            *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 4;
            psVar5 = this->output_type_;
            if (psVar5 == (string *)internal::kEmptyString_abi_cxx11_) {
              psVar5 = (string *)operator_new(0x20);
              (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
              psVar5->_M_string_length = 0;
              (psVar5->field_2)._M_local_buf[0] = '\0';
              this->output_type_ = psVar5;
            }
            bVar3 = internal::WireFormatLite::ReadString(input,psVar5);
            if (!bVar3) {
              return false;
            }
            internal::WireFormat::VerifyUTF8StringFallback
                      ((this->output_type_->_M_dataplus)._M_p,
                       (int)this->output_type_->_M_string_length,PARSE);
            puVar2 = input->buffer_;
            if ((puVar2 < input->buffer_end_) && (*puVar2 == '\"')) {
              input->buffer_ = puVar2 + 1;
LAB_001ec508:
              *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 8;
              this_00 = this->options_;
              if (this_00 == (MethodOptions *)0x0) {
                this_00 = (MethodOptions *)operator_new(0x60);
                MethodOptions::MethodOptions(this_00);
                this->options_ = this_00;
              }
              puVar2 = input->buffer_;
              if ((puVar2 < input->buffer_end_) && (-1 < (char)*puVar2)) {
                uStack_38 = CONCAT44((int)(char)*puVar2,(undefined4)uStack_38);
                input->buffer_ = puVar2 + 1;
              }
              else {
                bVar3 = io::CodedInputStream::ReadVarint32Fallback
                                  (input,(uint32 *)((long)&uStack_38 + 4));
                if (!bVar3) {
                  return false;
                }
              }
              iVar1 = input->recursion_depth_;
              input->recursion_depth_ = iVar1 + 1;
              if (input->recursion_limit_ <= iVar1) {
                return false;
              }
              limit = io::CodedInputStream::PushLimit(input,uStack_38._4_4_);
              bVar3 = MethodOptions::MergePartialFromCodedStream(this_00,input);
              if (!bVar3) {
                return false;
              }
              if (input->legitimate_message_end_ != true) {
                return false;
              }
              io::CodedInputStream::PopLimit(input,limit);
              if (0 < input->recursion_depth_) {
                input->recursion_depth_ = input->recursion_depth_ + -1;
              }
              if ((input->buffer_ == input->buffer_end_) &&
                 ((input->buffer_size_after_limit_ != 0 ||
                  (input->total_bytes_read_ == input->current_limit_)))) {
                input->last_tag_ = 0;
                input->legitimate_message_end_ = true;
                return true;
              }
            }
          }
        }
        goto LAB_001ec31d;
      }
      break;
    case 2:
      if (uVar4 == 2) goto LAB_001ec426;
      break;
    case 3:
      if (uVar4 == 2) goto LAB_001ec497;
      break;
    case 4:
      if (uVar4 == 2) goto LAB_001ec508;
    }
    if (uVar4 == 4) {
      return true;
    }
    bVar3 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
    if (!bVar3) {
      return false;
    }
  } while( true );
}

Assistant:

bool MethodDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_input_type;
        break;
      }

      // optional string input_type = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_input_type:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_input_type()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->input_type().data(), this->input_type().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(26)) goto parse_output_type;
        break;
      }

      // optional string output_type = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_output_type:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_output_type()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->output_type().data(), this->output_type().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(34)) goto parse_options;
        break;
      }

      // optional .google.protobuf.MethodOptions options = 4;
      case 4: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_options:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}